

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

size_t __thiscall CoreML::Specification::Scaler::ByteSizeLong(Scaler *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)(this->shiftvalue_).current_size_;
  lVar3 = uVar6 * 8;
  uVar5 = (uint)lVar3;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else if ((int)uVar5 < 0) {
    uVar6 = 0xb;
  }
  else {
    iVar2 = 0x1f;
    if ((uVar5 | 1) != 0) {
      for (; (uVar5 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar6 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
  }
  this->_shiftvalue_cached_byte_size_ = uVar5;
  lVar3 = uVar6 + lVar3;
  uVar6 = (ulong)(uint)(this->scalevalue_).current_size_;
  lVar1 = uVar6 * 8;
  uVar5 = (uint)lVar1;
  if (uVar6 != 0) {
    if ((int)uVar5 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar6 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    lVar3 = lVar3 + uVar6;
  }
  this->_scalevalue_cached_byte_size_ = uVar5;
  sVar4 = lVar3 + lVar1;
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}